

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RtAudio.cpp
# Opt level: O3

bool __thiscall
RtApiAlsa::probeDeviceOpen
          (RtApiAlsa *this,uint deviceId,StreamMode mode,uint channels,uint firstChannel,
          uint sampleRate,RtAudioFormat format,uint *bufferSize,StreamOptions *options)

{
  ostringstream *poVar1;
  pthread_cond_t *__cond;
  snd_pcm_t *__arg;
  undefined8 uVar2;
  long lVar3;
  RtAudioFormat RVar4;
  undefined8 uVar5;
  size_type *psVar6;
  _Alloc_hider _Var7;
  snd_pcm_t sVar8;
  int iVar9;
  int iVar10;
  undefined4 uVar11;
  uint uVar12;
  uint uVar13;
  long lVar14;
  size_t sVar15;
  ostream *poVar16;
  char *pcVar17;
  void *pvVar18;
  undefined8 *puVar19;
  bool bVar20;
  pointer ppVar21;
  bool bVar22;
  string *psVar23;
  undefined1 *__s;
  undefined8 uStack_f0;
  undefined1 auStack_e8 [12];
  sched_param local_dc;
  uint uStack_d8;
  sched_param param;
  snd_pcm_uframes_t periodSize;
  snd_pcm_uframes_t val;
  uint local_c0;
  int dir;
  uint sampleRate_local;
  pthread_attr_t attr;
  size_type *psStack_78;
  uint value;
  string name;
  uint local_4c;
  long lStack_48;
  uint periods;
  long local_40;
  snd_pcm_t *phandle;
  snd_pcm_t *psVar24;
  
  __s = auStack_e8;
  psStack_78 = &name._M_string_length;
  name._M_dataplus._M_p = (pointer)0x0;
  name._M_string_length._0_1_ = 0;
  for (ppVar21 = (this->deviceIdPairs_).
                 super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                 ._M_impl.super__Vector_impl_data._M_start; local_c0 = sampleRate,
      ppVar21 !=
      (this->deviceIdPairs_).
      super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
      ._M_impl.super__Vector_impl_data._M_finish; ppVar21 = ppVar21 + 1) {
    if (ppVar21->second == deviceId) {
      uStack_f0 = 0x18971a;
      std::__cxx11::string::_M_assign((string *)&stack0xffffffffffffff88);
      break;
    }
  }
  uStack_f0 = 0x189737;
  iVar9 = snd_pcm_open(&local_40,psStack_78,mode != OUTPUT,2);
  if (iVar9 < 0) {
    poVar1 = &(this->super_RtApi).errorStream_;
    if (mode == OUTPUT) {
      uStack_f0 = 0x1898b7;
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)poVar1,"RtApiAlsa::probeDeviceOpen: pcm device (",0x28);
      uStack_f0 = 0x1898c7;
      poVar16 = std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)poVar1,(char *)psStack_78,(long)name._M_dataplus._M_p);
      lVar14 = 0x18;
      pcVar17 = ") won\'t open for output.";
    }
    else {
      uStack_f0 = 0x189807;
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)poVar1,"RtApiAlsa::probeDeviceOpen: pcm device (",0x28);
      uStack_f0 = 0x189817;
      poVar16 = std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)poVar1,(char *)psStack_78,(long)name._M_dataplus._M_p);
      lVar14 = 0x17;
      pcVar17 = ") won\'t open for input.";
    }
    uStack_f0 = 0x1898db;
    std::__ostream_insert<char,std::char_traits<char>>(poVar16,pcVar17,lVar14);
    uStack_f0 = 0x1898eb;
    std::__cxx11::stringbuf::str();
    psVar23 = (string *)&(this->super_RtApi).errorText_;
LAB_0018a721:
    *(undefined8 *)(__s + -8) = 0x18a729;
    std::__cxx11::string::operator=(psVar23,(string *)&sampleRate_local);
    if ((char *)_sampleRate_local != attr.__size + 8) {
      *(undefined8 *)(__s + -8) = 0x18a73d;
      operator_delete((void *)_sampleRate_local);
    }
  }
  else {
    name.field_2._8_4_ = channels;
    uStack_f0 = 0x189752;
    dir = firstChannel;
    phandle = (snd_pcm_t *)this;
    lVar14 = snd_pcm_hw_params_sizeof();
    lVar14 = -(lVar14 + 0xfU & 0xfffffffffffffff0);
    __s = auStack_e8 + lVar14;
    *(undefined8 *)(auStack_e8 + lVar14 + -8) = 0x189768;
    sVar15 = snd_pcm_hw_params_sizeof();
    *(undefined8 *)(auStack_e8 + lVar14 + -8) = 0x189775;
    memset(__s,0,sVar15);
    lVar3 = local_40;
    *(undefined8 *)(auStack_e8 + lVar14 + -8) = 0x189781;
    iVar9 = snd_pcm_hw_params_any(lVar3,__s);
    lVar3 = local_40;
    if (iVar9 < 0) {
      *(undefined8 *)(auStack_e8 + lVar14 + -8) = 0x189831;
      snd_pcm_close(lVar3);
      poVar16 = (ostream *)(phandle + 8);
      *(undefined8 *)(auStack_e8 + lVar14 + -8) = 0x18984d;
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar16,"RtApiAlsa::probeDeviceOpen: error getting pcm device (",0x36);
      _Var7 = name._M_dataplus;
      psVar6 = psStack_78;
      *(undefined8 *)(auStack_e8 + lVar14 + -8) = 0x18985d;
      poVar16 = std::__ostream_insert<char,std::char_traits<char>>
                          (poVar16,(char *)psVar6,(long)_Var7._M_p);
      *(undefined8 *)(auStack_e8 + lVar14 + -8) = 0x189874;
      std::__ostream_insert<char,std::char_traits<char>>(poVar16,") parameters, ",0xe);
      *(undefined8 *)(auStack_e8 + lVar14 + -8) = 0x18987c;
      pcVar17 = (char *)snd_strerror(iVar9);
      if (pcVar17 == (char *)0x0) {
        uVar2 = *(undefined8 *)(*(long *)poVar16 + -0x18);
        *(undefined8 *)(auStack_e8 + lVar14 + -8) = 0x18994e;
        std::ios::clear((int)poVar16 + (int)uVar2);
      }
      else {
        *(undefined8 *)(auStack_e8 + lVar14 + -8) = 0x189890;
        sVar15 = strlen(pcVar17);
        *(undefined8 *)(auStack_e8 + lVar14 + -8) = 0x18989e;
        std::__ostream_insert<char,std::char_traits<char>>(poVar16,pcVar17,sVar15);
      }
      *(undefined8 *)(auStack_e8 + lVar14 + -8) = 0x189962;
      std::__ostream_insert<char,std::char_traits<char>>(poVar16,".",1);
      psVar24 = phandle;
      *(undefined8 *)(auStack_e8 + lVar14 + -8) = 0x189976;
      std::__cxx11::stringbuf::str();
LAB_0018a710:
      psVar23 = (string *)(psVar24 + 0x180);
      goto LAB_0018a721;
    }
    lStack_48 = (long)mode;
    if ((options == (StreamOptions *)0x0) || ((options->flags & 1) == 0)) {
      phandle[0x21a] = (snd_pcm_t)0x1;
      *(undefined8 *)(auStack_e8 + lVar14 + -8) = 0x1897c1;
      iVar9 = snd_pcm_hw_params_set_access(lVar3,__s,3);
      lVar3 = local_40;
      sVar8 = (snd_pcm_t)0x1;
      if (iVar9 < 0) {
        *(undefined8 *)(auStack_e8 + lVar14 + -8) = 0x1897dc;
        iVar9 = snd_pcm_hw_params_set_access(lVar3,__s,4);
        sVar8 = (snd_pcm_t)0x0;
        goto LAB_00189991;
      }
LAB_00189923:
      phandle[lStack_48 + 0x21b] = sVar8;
    }
    else {
      phandle[0x21a] = (snd_pcm_t)0x0;
      *(undefined8 *)(auStack_e8 + lVar14 + -8) = 0x18991d;
      iVar9 = snd_pcm_hw_params_set_access(lVar3,__s,4);
      lVar3 = local_40;
      if (-1 < iVar9) {
        sVar8 = (snd_pcm_t)0x0;
        goto LAB_00189923;
      }
      *(undefined8 *)(auStack_e8 + lVar14 + -8) = 0x18998c;
      iVar9 = snd_pcm_hw_params_set_access(lVar3,__s,3);
      sVar8 = (snd_pcm_t)0x1;
LAB_00189991:
      lVar3 = local_40;
      phandle[lStack_48 + 0x21b] = sVar8;
      if (iVar9 < 0) {
        *(undefined8 *)(auStack_e8 + lVar14 + -8) = 0x189a01;
        snd_pcm_close(lVar3);
        poVar16 = (ostream *)(phandle + 8);
        *(undefined8 *)(auStack_e8 + lVar14 + -8) = 0x189a1d;
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar16,"RtApiAlsa::probeDeviceOpen: error setting pcm device (",0x36);
        _Var7 = name._M_dataplus;
        psVar6 = psStack_78;
        *(undefined8 *)(auStack_e8 + lVar14 + -8) = 0x189a2d;
        poVar16 = std::__ostream_insert<char,std::char_traits<char>>
                            (poVar16,(char *)psVar6,(long)_Var7._M_p);
        *(undefined8 *)(auStack_e8 + lVar14 + -8) = 0x189a44;
        std::__ostream_insert<char,std::char_traits<char>>(poVar16,") access, ",10);
        *(undefined8 *)(auStack_e8 + lVar14 + -8) = 0x189a4c;
        pcVar17 = (char *)snd_strerror(iVar9);
        if (pcVar17 == (char *)0x0) {
          uVar2 = *(undefined8 *)(*(long *)poVar16 + -0x18);
          *(undefined8 *)(auStack_e8 + lVar14 + -8) = 0x189bed;
          std::ios::clear((int)poVar16 + (int)uVar2);
        }
        else {
          *(undefined8 *)(auStack_e8 + lVar14 + -8) = 0x189a60;
          sVar15 = strlen(pcVar17);
          *(undefined8 *)(auStack_e8 + lVar14 + -8) = 0x189a6e;
          std::__ostream_insert<char,std::char_traits<char>>(poVar16,pcVar17,sVar15);
        }
        *(undefined8 *)(auStack_e8 + lVar14 + -8) = 0x189c01;
        std::__ostream_insert<char,std::char_traits<char>>(poVar16,".",1);
        psVar24 = phandle;
        *(undefined8 *)(auStack_e8 + lVar14 + -8) = 0x189c15;
        std::__cxx11::stringbuf::str();
        goto LAB_0018a710;
      }
    }
    lVar3 = local_40;
    *(RtAudioFormat *)(phandle + 600) = format;
    switch(format) {
    case 1:
      iVar9 = 0;
      break;
    case 2:
      iVar9 = 2;
      break;
    case 3:
    case 5:
    case 6:
    case 7:
switchD_001899c8_caseD_3:
      iVar9 = -1;
      break;
    case 4:
      iVar9 = 6;
      break;
    case 8:
      iVar9 = 10;
      break;
    default:
      if (format == 0x10) {
        iVar9 = 0xe;
      }
      else {
        if (format != 0x20) goto switchD_001899c8_caseD_3;
        iVar9 = 0x10;
      }
    }
    *(undefined8 *)(auStack_e8 + lVar14 + -8) = 0x189aa0;
    iVar10 = snd_pcm_hw_params_test_format(lVar3,__s,iVar9);
    lVar3 = local_40;
    if (iVar10 != 0) {
      iVar9 = 0x10;
      *(undefined8 *)(auStack_e8 + lVar14 + -8) = 0x189abf;
      iVar10 = snd_pcm_hw_params_test_format(lVar3,__s,0x10);
      lVar3 = local_40;
      if (iVar10 == 0) {
        format = 0x20;
      }
      else {
        iVar9 = 0xe;
        *(undefined8 *)(auStack_e8 + lVar14 + -8) = 0x189ade;
        iVar10 = snd_pcm_hw_params_test_format(lVar3,__s,0xe);
        lVar3 = local_40;
        if (iVar10 == 0) {
          format = 0x10;
        }
        else {
          iVar9 = 10;
          *(undefined8 *)(auStack_e8 + lVar14 + -8) = 0x189afd;
          iVar10 = snd_pcm_hw_params_test_format(lVar3,__s,10);
          lVar3 = local_40;
          if (iVar10 == 0) {
            format = 8;
          }
          else {
            iVar9 = 6;
            *(undefined8 *)(auStack_e8 + lVar14 + -8) = 0x189b1c;
            iVar10 = snd_pcm_hw_params_test_format(lVar3,__s,6);
            lVar3 = local_40;
            if (iVar10 == 0) {
              format = 4;
            }
            else {
              iVar9 = 2;
              *(undefined8 *)(auStack_e8 + lVar14 + -8) = 0x189b3b;
              iVar10 = snd_pcm_hw_params_test_format(lVar3,__s,2);
              lVar3 = local_40;
              if (iVar10 == 0) {
                format = 2;
              }
              else {
                iVar9 = 0;
                *(undefined8 *)(auStack_e8 + lVar14 + -8) = 0x189b54;
                iVar10 = snd_pcm_hw_params_test_format(lVar3,__s,0);
                lVar3 = local_40;
                if (iVar10 != 0) {
                  *(undefined8 *)(auStack_e8 + lVar14 + -8) = 0x189b65;
                  snd_pcm_close(lVar3);
                  poVar16 = (ostream *)(phandle + 8);
                  *(undefined8 *)(auStack_e8 + lVar14 + -8) = 0x189b81;
                  std::__ostream_insert<char,std::char_traits<char>>
                            (poVar16,"RtApiAlsa::probeDeviceOpen: pcm device (",0x28);
                  _Var7 = name._M_dataplus;
                  psVar6 = psStack_78;
                  *(undefined8 *)(auStack_e8 + lVar14 + -8) = 0x189b91;
                  poVar16 = std::__ostream_insert<char,std::char_traits<char>>
                                      (poVar16,(char *)psVar6,(long)_Var7._M_p);
                  *(undefined8 *)(auStack_e8 + lVar14 + -8) = 0x189ba5;
                  std::__ostream_insert<char,std::char_traits<char>>
                            (poVar16,") data format not supported by RtAudio.",0x27);
                  psVar24 = phandle;
                  *(undefined8 *)(auStack_e8 + lVar14 + -8) = 0x189bb9;
                  std::__cxx11::stringbuf::str();
                  goto LAB_0018a710;
                }
                format = 1;
              }
            }
          }
        }
      }
    }
    lVar3 = local_40;
    *(RtAudioFormat *)(phandle + lStack_48 * 8 + 0x260) = format;
    *(undefined8 *)(auStack_e8 + lVar14 + -8) = 0x189c4c;
    iVar10 = snd_pcm_hw_params_set_format(lVar3,__s,iVar9);
    lVar3 = local_40;
    if (iVar10 < 0) {
      *(undefined8 *)(auStack_e8 + lVar14 + -8) = 0x189d0c;
      snd_pcm_close(lVar3);
      poVar16 = (ostream *)(phandle + 8);
      *(undefined8 *)(auStack_e8 + lVar14 + -8) = 0x189d28;
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar16,"RtApiAlsa::probeDeviceOpen: error setting pcm device (",0x36);
      _Var7 = name._M_dataplus;
      psVar6 = psStack_78;
      *(undefined8 *)(auStack_e8 + lVar14 + -8) = 0x189d38;
      poVar16 = std::__ostream_insert<char,std::char_traits<char>>
                          (poVar16,(char *)psVar6,(long)_Var7._M_p);
      *(undefined8 *)(auStack_e8 + lVar14 + -8) = 0x189d4f;
      std::__ostream_insert<char,std::char_traits<char>>(poVar16,") data format, ",0xf);
      *(undefined8 *)(auStack_e8 + lVar14 + -8) = 0x189d56;
      pcVar17 = (char *)snd_strerror(iVar10);
      if (pcVar17 == (char *)0x0) {
        uVar2 = *(undefined8 *)(*(long *)poVar16 + -0x18);
        *(undefined8 *)(auStack_e8 + lVar14 + -8) = 0x189ef2;
        std::ios::clear((int)poVar16 + (int)uVar2);
      }
      else {
        *(undefined8 *)(auStack_e8 + lVar14 + -8) = 0x189d6a;
        sVar15 = strlen(pcVar17);
        *(undefined8 *)(auStack_e8 + lVar14 + -8) = 0x189d78;
        std::__ostream_insert<char,std::char_traits<char>>(poVar16,pcVar17,sVar15);
      }
      *(undefined8 *)(auStack_e8 + lVar14 + -8) = 0x189f06;
      std::__ostream_insert<char,std::char_traits<char>>(poVar16,".",1);
      psVar24 = phandle;
      *(undefined8 *)(auStack_e8 + lVar14 + -8) = 0x189f1a;
      std::__cxx11::stringbuf::str();
      goto LAB_0018a710;
    }
    phandle[lStack_48 + 0x21d] = (snd_pcm_t)0x0;
    if (iVar9 != 0) {
      *(undefined8 *)(auStack_e8 + lVar14 + -8) = 0x189c77;
      iVar9 = snd_pcm_format_cpu_endian(iVar9);
      lVar3 = local_40;
      if (iVar9 == 0) {
        phandle[lStack_48 + 0x21d] = (snd_pcm_t)0x1;
      }
      else if (iVar9 < 0) {
        *(undefined8 *)(auStack_e8 + lVar14 + -8) = 0x189c91;
        snd_pcm_close(lVar3);
        poVar16 = (ostream *)(phandle + 8);
        *(undefined8 *)(auStack_e8 + lVar14 + -8) = 0x189cad;
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar16,"RtApiAlsa::probeDeviceOpen: error getting pcm device (",0x36);
        _Var7 = name._M_dataplus;
        psVar6 = psStack_78;
        *(undefined8 *)(auStack_e8 + lVar14 + -8) = 0x189cbd;
        poVar16 = std::__ostream_insert<char,std::char_traits<char>>
                            (poVar16,(char *)psVar6,(long)_Var7._M_p);
        *(undefined8 *)(auStack_e8 + lVar14 + -8) = 0x189cd4;
        std::__ostream_insert<char,std::char_traits<char>>(poVar16,") endian-ness, ",0xf);
        *(undefined8 *)(auStack_e8 + lVar14 + -8) = 0x189cdc;
        pcVar17 = (char *)snd_strerror(iVar9);
        if (pcVar17 == (char *)0x0) {
          uVar2 = *(undefined8 *)(*(long *)poVar16 + -0x18);
          *(undefined8 *)(auStack_e8 + lVar14 + -8) = 0x18a1c0;
          std::ios::clear((int)poVar16 + (int)uVar2);
        }
        else {
          *(undefined8 *)(auStack_e8 + lVar14 + -8) = 0x189cf0;
          sVar15 = strlen(pcVar17);
          *(undefined8 *)(auStack_e8 + lVar14 + -8) = 0x189cfe;
          std::__ostream_insert<char,std::char_traits<char>>(poVar16,pcVar17,sVar15);
        }
        *(undefined8 *)(auStack_e8 + lVar14 + -8) = 0x18a1d4;
        std::__ostream_insert<char,std::char_traits<char>>(poVar16,".",1);
        psVar24 = phandle;
        *(undefined8 *)(auStack_e8 + lVar14 + -8) = 0x18a1e8;
        std::__cxx11::stringbuf::str();
        goto LAB_0018a710;
      }
    }
    lVar3 = local_40;
    *(undefined8 *)(auStack_e8 + lVar14 + -8) = 0x189da2;
    iVar9 = snd_pcm_hw_params_set_rate_near(lVar3,__s,&local_c0,0);
    lVar3 = local_40;
    if (iVar9 < 0) {
      *(undefined8 *)(auStack_e8 + lVar14 + -8) = 0x189e67;
      snd_pcm_close(lVar3);
      poVar16 = (ostream *)(phandle + 8);
      *(undefined8 *)(auStack_e8 + lVar14 + -8) = 0x189e83;
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar16,"RtApiAlsa::probeDeviceOpen: error setting sample rate on device (",0x41);
      _Var7 = name._M_dataplus;
      psVar6 = psStack_78;
      *(undefined8 *)(auStack_e8 + lVar14 + -8) = 0x189e93;
      poVar16 = std::__ostream_insert<char,std::char_traits<char>>
                          (poVar16,(char *)psVar6,(long)_Var7._M_p);
      *(undefined8 *)(auStack_e8 + lVar14 + -8) = 0x189eaa;
      std::__ostream_insert<char,std::char_traits<char>>(poVar16,"), ",3);
      *(undefined8 *)(auStack_e8 + lVar14 + -8) = 0x189eb1;
      pcVar17 = (char *)snd_strerror(iVar9);
      if (pcVar17 == (char *)0x0) {
        uVar2 = *(undefined8 *)(*(long *)poVar16 + -0x18);
        *(undefined8 *)(auStack_e8 + lVar14 + -8) = 0x18a0ed;
        std::ios::clear((int)poVar16 + (int)uVar2);
      }
      else {
        *(undefined8 *)(auStack_e8 + lVar14 + -8) = 0x189ec5;
        sVar15 = strlen(pcVar17);
        *(undefined8 *)(auStack_e8 + lVar14 + -8) = 0x189ed3;
        std::__ostream_insert<char,std::char_traits<char>>(poVar16,pcVar17,sVar15);
      }
      *(undefined8 *)(auStack_e8 + lVar14 + -8) = 0x18a101;
      std::__ostream_insert<char,std::char_traits<char>>(poVar16,".",1);
      psVar24 = phandle;
      *(undefined8 *)(auStack_e8 + lVar14 + -8) = 0x18a115;
      std::__cxx11::stringbuf::str();
      goto LAB_0018a710;
    }
    *(undefined4 *)(phandle + lStack_48 * 4 + 0x22c) = name.field_2._8_4_;
    *(undefined8 *)(auStack_e8 + lVar14 + -8) = 0x189dca;
    iVar9 = snd_pcm_hw_params_get_channels_max(__s,attr.__size + 0x34);
    lVar3 = local_40;
    if (iVar9 < 0) {
LAB_00189de3:
      *(undefined8 *)(auStack_e8 + lVar14 + -8) = 0x189dec;
      snd_pcm_close(lVar3);
      poVar16 = (ostream *)(phandle + 8);
      *(undefined8 *)(auStack_e8 + lVar14 + -8) = 0x189e08;
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar16,
                 "RtApiAlsa::probeDeviceOpen: requested channel parameters not supported by device ("
                 ,0x52);
      _Var7 = name._M_dataplus;
      psVar6 = psStack_78;
      *(undefined8 *)(auStack_e8 + lVar14 + -8) = 0x189e18;
      poVar16 = std::__ostream_insert<char,std::char_traits<char>>
                          (poVar16,(char *)psVar6,(long)_Var7._M_p);
      *(undefined8 *)(auStack_e8 + lVar14 + -8) = 0x189e2f;
      std::__ostream_insert<char,std::char_traits<char>>(poVar16,"), ",3);
      *(undefined8 *)(auStack_e8 + lVar14 + -8) = 0x189e37;
      pcVar17 = (char *)snd_strerror(iVar9);
      if (pcVar17 == (char *)0x0) {
        uVar2 = *(undefined8 *)(*(long *)poVar16 + -0x18);
        *(undefined8 *)(auStack_e8 + lVar14 + -8) = 0x18a0a6;
        std::ios::clear((int)poVar16 + (int)uVar2);
      }
      else {
        *(undefined8 *)(auStack_e8 + lVar14 + -8) = 0x189e4b;
        sVar15 = strlen(pcVar17);
        *(undefined8 *)(auStack_e8 + lVar14 + -8) = 0x189e59;
        std::__ostream_insert<char,std::char_traits<char>>(poVar16,pcVar17,sVar15);
      }
      *(undefined8 *)(auStack_e8 + lVar14 + -8) = 0x18a0ba;
      std::__ostream_insert<char,std::char_traits<char>>(poVar16,".",1);
      psVar24 = phandle;
      *(undefined8 *)(auStack_e8 + lVar14 + -8) = 0x18a0ce;
      std::__cxx11::stringbuf::str();
      goto LAB_0018a710;
    }
    uVar11 = name.field_2._8_4_ + dir;
    if ((uint)attr._52_4_ < (uint)uVar11) goto LAB_00189de3;
    *(undefined8 *)(auStack_e8 + lVar14 + -8) = 0x189f2d;
    iVar9 = snd_pcm_hw_params_get_channels_min(__s,attr.__size + 0x34);
    lVar3 = local_40;
    if (iVar9 < 0) {
      *(undefined8 *)(auStack_e8 + lVar14 + -8) = 0x18a123;
      snd_pcm_close(lVar3);
      poVar16 = (ostream *)(phandle + 8);
      *(undefined8 *)(auStack_e8 + lVar14 + -8) = 0x18a13f;
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar16,"RtApiAlsa::probeDeviceOpen: error getting minimum channels for device (",
                 0x47);
      _Var7 = name._M_dataplus;
      psVar6 = psStack_78;
      *(undefined8 *)(auStack_e8 + lVar14 + -8) = 0x18a14f;
      poVar16 = std::__ostream_insert<char,std::char_traits<char>>
                          (poVar16,(char *)psVar6,(long)_Var7._M_p);
      *(undefined8 *)(auStack_e8 + lVar14 + -8) = 0x18a166;
      std::__ostream_insert<char,std::char_traits<char>>(poVar16,"), ",3);
      *(undefined8 *)(auStack_e8 + lVar14 + -8) = 0x18a16e;
      pcVar17 = (char *)snd_strerror(iVar9);
      *(undefined8 *)(auStack_e8 + lVar14 + -8) = 0x18a179;
      poVar16 = std::operator<<(poVar16,pcVar17);
      *(undefined8 *)(auStack_e8 + lVar14 + -8) = 0x18a18d;
      std::__ostream_insert<char,std::char_traits<char>>(poVar16,".",1);
      psVar24 = phandle;
      *(undefined8 *)(auStack_e8 + lVar14 + -8) = 0x18a1a1;
      std::__cxx11::stringbuf::str();
      goto LAB_0018a710;
    }
    if ((uint)uVar11 < (uint)attr._52_4_) {
      uVar11 = attr._52_4_;
    }
    *(undefined4 *)(phandle + lStack_48 * 4 + 0x234) = uVar11;
    *(undefined8 *)(auStack_e8 + lVar14 + -8) = 0x189f5d;
    iVar9 = snd_pcm_hw_params_set_channels(lVar3,__s,uVar11);
    lVar3 = local_40;
    if (iVar9 < 0) {
      *(undefined8 *)(auStack_e8 + lVar14 + -8) = 0x18a1f6;
      snd_pcm_close(lVar3);
      poVar16 = (ostream *)(phandle + 8);
      *(undefined8 *)(auStack_e8 + lVar14 + -8) = 0x18a212;
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar16,"RtApiAlsa::probeDeviceOpen: error setting channels for device (",0x3f);
      _Var7 = name._M_dataplus;
      psVar6 = psStack_78;
      *(undefined8 *)(auStack_e8 + lVar14 + -8) = 0x18a222;
      poVar16 = std::__ostream_insert<char,std::char_traits<char>>
                          (poVar16,(char *)psVar6,(long)_Var7._M_p);
      *(undefined8 *)(auStack_e8 + lVar14 + -8) = 0x18a239;
      std::__ostream_insert<char,std::char_traits<char>>(poVar16,"), ",3);
      *(undefined8 *)(auStack_e8 + lVar14 + -8) = 0x18a240;
      pcVar17 = (char *)snd_strerror(iVar9);
      *(undefined8 *)(auStack_e8 + lVar14 + -8) = 0x18a24b;
      poVar16 = std::operator<<(poVar16,pcVar17);
      *(undefined8 *)(auStack_e8 + lVar14 + -8) = 0x18a25f;
      std::__ostream_insert<char,std::char_traits<char>>(poVar16,".",1);
      psVar24 = phandle;
      *(undefined8 *)(auStack_e8 + lVar14 + -8) = 0x18a273;
      std::__cxx11::stringbuf::str();
      goto LAB_0018a710;
    }
    val._4_4_ = 0;
    _uStack_d8 = (ulong)*bufferSize;
    *(undefined8 *)(auStack_e8 + lVar14 + -8) = 0x189f91;
    iVar9 = snd_pcm_hw_params_set_period_size_near(lVar3,__s);
    lVar3 = local_40;
    if (iVar9 < 0) {
      *(undefined8 *)(auStack_e8 + lVar14 + -8) = 0x18a281;
      snd_pcm_close(lVar3);
      poVar16 = (ostream *)(phandle + 8);
      *(undefined8 *)(auStack_e8 + lVar14 + -8) = 0x18a29d;
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar16,"RtApiAlsa::probeDeviceOpen: error setting period size for device (",0x42);
      _Var7 = name._M_dataplus;
      psVar6 = psStack_78;
      *(undefined8 *)(auStack_e8 + lVar14 + -8) = 0x18a2ad;
      poVar16 = std::__ostream_insert<char,std::char_traits<char>>
                          (poVar16,(char *)psVar6,(long)_Var7._M_p);
      *(undefined8 *)(auStack_e8 + lVar14 + -8) = 0x18a2c4;
      std::__ostream_insert<char,std::char_traits<char>>(poVar16,"), ",3);
      *(undefined8 *)(auStack_e8 + lVar14 + -8) = 0x18a2cb;
      pcVar17 = (char *)snd_strerror(iVar9);
      *(undefined8 *)(auStack_e8 + lVar14 + -8) = 0x18a2d6;
      poVar16 = std::operator<<(poVar16,pcVar17);
      *(undefined8 *)(auStack_e8 + lVar14 + -8) = 0x18a2ea;
      std::__ostream_insert<char,std::char_traits<char>>(poVar16,".",1);
      psVar24 = phandle;
      *(undefined8 *)(auStack_e8 + lVar14 + -8) = 0x18a2fe;
      std::__cxx11::stringbuf::str();
      goto LAB_0018a710;
    }
    *bufferSize = uStack_d8;
    local_4c = 0;
    if (options == (StreamOptions *)0x0) {
LAB_00189fd8:
      local_4c = 4;
    }
    else {
      uVar12 = 0;
      if ((options->flags & 2) != 0) {
        local_4c = 2;
        uVar12 = 2;
      }
      uVar13 = options->numberOfBuffers;
      if (uVar13 != 0) {
        uVar12 = uVar13;
        local_4c = uVar13;
      }
      if (uVar12 < 2) goto LAB_00189fd8;
    }
    *(undefined8 *)(auStack_e8 + lVar14 + -8) = 0x189ff6;
    iVar9 = snd_pcm_hw_params_set_periods_near(lVar3,__s,&local_4c,(long)&val + 4);
    lVar3 = local_40;
    if (iVar9 < 0) {
      *(undefined8 *)(auStack_e8 + lVar14 + -8) = 0x18a30c;
      snd_pcm_close(lVar3);
      poVar16 = (ostream *)(phandle + 8);
      *(undefined8 *)(auStack_e8 + lVar14 + -8) = 0x18a328;
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar16,"RtApiAlsa::probeDeviceOpen: error setting periods for device (",0x3e);
      _Var7 = name._M_dataplus;
      psVar6 = psStack_78;
      *(undefined8 *)(auStack_e8 + lVar14 + -8) = 0x18a338;
      poVar16 = std::__ostream_insert<char,std::char_traits<char>>
                          (poVar16,(char *)psVar6,(long)_Var7._M_p);
      *(undefined8 *)(auStack_e8 + lVar14 + -8) = 0x18a34f;
      std::__ostream_insert<char,std::char_traits<char>>(poVar16,"), ",3);
      *(undefined8 *)(auStack_e8 + lVar14 + -8) = 0x18a356;
      pcVar17 = (char *)snd_strerror(iVar9);
      *(undefined8 *)(auStack_e8 + lVar14 + -8) = 0x18a361;
      poVar16 = std::operator<<(poVar16,pcVar17);
      *(undefined8 *)(auStack_e8 + lVar14 + -8) = 0x18a375;
      std::__ostream_insert<char,std::char_traits<char>>(poVar16,".",1);
      psVar24 = phandle;
      *(undefined8 *)(auStack_e8 + lVar14 + -8) = 0x18a389;
      std::__cxx11::stringbuf::str();
      goto LAB_0018a710;
    }
    if (((mode == INPUT) && (*(int *)(phandle + 0x1f8) == 0)) &&
       (*bufferSize != *(uint *)(phandle + 0x224))) {
      *(undefined8 *)(auStack_e8 + lVar14 + -8) = 0x18a033;
      snd_pcm_close(lVar3);
      poVar16 = (ostream *)(phandle + 8);
      *(undefined8 *)(auStack_e8 + lVar14 + -8) = 0x18a04f;
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar16,
                 "RtApiAlsa::probeDeviceOpen: system error setting buffer size for duplex stream on device ("
                 ,0x5a);
      _Var7 = name._M_dataplus;
      psVar6 = psStack_78;
      *(undefined8 *)(auStack_e8 + lVar14 + -8) = 0x18a05f;
      poVar16 = std::__ostream_insert<char,std::char_traits<char>>
                          (poVar16,(char *)psVar6,(long)_Var7._M_p);
      *(undefined8 *)(auStack_e8 + lVar14 + -8) = 0x18a073;
      std::__ostream_insert<char,std::char_traits<char>>(poVar16,").",2);
      psVar24 = phandle;
      *(undefined8 *)(auStack_e8 + lVar14 + -8) = 0x18a087;
      std::__cxx11::stringbuf::str();
      goto LAB_0018a710;
    }
    *(uint *)(phandle + 0x224) = *bufferSize;
    *(undefined8 *)(auStack_e8 + lVar14 + -8) = 0x18a3a0;
    iVar9 = snd_pcm_hw_params(lVar3);
    lVar3 = local_40;
    if (iVar9 < 0) {
      *(undefined8 *)(auStack_e8 + lVar14 + -8) = 0x18a693;
      snd_pcm_close(lVar3);
      poVar16 = (ostream *)(phandle + 8);
      *(undefined8 *)(auStack_e8 + lVar14 + -8) = 0x18a6af;
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar16,
                 "RtApiAlsa::probeDeviceOpen: error installing hardware configuration on device (",
                 0x4f);
      _Var7 = name._M_dataplus;
      psVar6 = psStack_78;
      *(undefined8 *)(auStack_e8 + lVar14 + -8) = 0x18a6bf;
      poVar16 = std::__ostream_insert<char,std::char_traits<char>>
                          (poVar16,(char *)psVar6,(long)_Var7._M_p);
      *(undefined8 *)(auStack_e8 + lVar14 + -8) = 0x18a6d6;
      std::__ostream_insert<char,std::char_traits<char>>(poVar16,"), ",3);
      *(undefined8 *)(auStack_e8 + lVar14 + -8) = 0x18a6dd;
      pcVar17 = (char *)snd_strerror(iVar9);
      *(undefined8 *)(auStack_e8 + lVar14 + -8) = 0x18a6e8;
      poVar16 = std::operator<<(poVar16,pcVar17);
      *(undefined8 *)(auStack_e8 + lVar14 + -8) = 0x18a6fc;
      std::__ostream_insert<char,std::char_traits<char>>(poVar16,".",1);
      psVar24 = phandle;
      *(undefined8 *)(auStack_e8 + lVar14 + -8) = 0x18a710;
      std::__cxx11::stringbuf::str();
      goto LAB_0018a710;
    }
    *(undefined8 *)(auStack_e8 + lVar14 + -8) = 0x18a3af;
    lVar14 = snd_pcm_sw_params_sizeof();
    __s = __s + -(lVar14 + 0xfU & 0xfffffffffffffff0);
    *(undefined8 *)(__s + -8) = 0x18a3c5;
    sVar15 = snd_pcm_sw_params_sizeof();
    *(undefined8 *)(__s + -8) = 0x18a3d2;
    memset(__s,0,sVar15);
    lVar14 = local_40;
    *(undefined8 *)(__s + -8) = 0x18a3de;
    snd_pcm_sw_params_current(lVar14,__s);
    lVar14 = local_40;
    uVar12 = *bufferSize;
    *(undefined8 *)(__s + -8) = 0x18a3f0;
    snd_pcm_sw_params_set_start_threshold(lVar14,__s,uVar12);
    lVar14 = local_40;
    *(undefined8 *)(__s + -8) = 0x18a403;
    snd_pcm_sw_params_set_stop_threshold(lVar14,__s,0xffffffffffffffff);
    lVar14 = local_40;
    *(undefined8 *)(__s + -8) = 0x18a411;
    snd_pcm_sw_params_set_silence_threshold(lVar14,__s,0);
    *(undefined8 *)(__s + -8) = 0x18a420;
    snd_pcm_sw_params_get_boundary(__s,&periodSize);
    psVar24 = phandle;
    lVar14 = local_40;
    *(undefined8 *)(__s + -8) = 0x18a437;
    snd_pcm_sw_params_set_silence_size(lVar14,__s,periodSize);
    lVar14 = local_40;
    *(undefined8 *)(__s + -8) = 0x18a443;
    iVar9 = snd_pcm_sw_params(lVar14);
    lVar14 = local_40;
    if (iVar9 < 0) {
      *(undefined8 *)(__s + -8) = 0x18a76d;
      snd_pcm_close(lVar14);
      *(undefined8 *)(__s + -8) = 0x18a785;
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)(psVar24 + 8),
                 "RtApiAlsa::probeDeviceOpen: error installing software configuration on device (",
                 0x4f);
      _Var7 = name._M_dataplus;
      psVar6 = psStack_78;
      *(undefined8 *)(__s + -8) = 0x18a795;
      poVar16 = std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)(psVar24 + 8),(char *)psVar6,(long)_Var7._M_p);
      *(undefined8 *)(__s + -8) = 0x18a7ac;
      std::__ostream_insert<char,std::char_traits<char>>(poVar16,"), ",3);
      *(undefined8 *)(__s + -8) = 0x18a7b3;
      pcVar17 = (char *)snd_strerror(iVar9);
      *(undefined8 *)(__s + -8) = 0x18a7be;
      poVar16 = std::operator<<(poVar16,pcVar17);
      *(undefined8 *)(__s + -8) = 0x18a7d2;
      std::__ostream_insert<char,std::char_traits<char>>(poVar16,".",1);
      *(undefined8 *)(__s + -8) = 0x18a7e2;
      std::__cxx11::stringbuf::str();
      psVar23 = (string *)(psVar24 + 0x180);
      goto LAB_0018a721;
    }
    lVar14 = *(long *)(psVar24 + 600);
    lVar3 = *(long *)(psVar24 + lStack_48 * 8 + 0x260);
    psVar24[lStack_48 + 0x218] = (snd_pcm_t)(lVar14 != lVar3);
    psVar24[lStack_48 + 0x218] =
         (snd_pcm_t)
         (*(uint *)(psVar24 + lStack_48 * 4 + 0x22c) < *(uint *)(psVar24 + lStack_48 * 4 + 0x234) ||
         lVar14 != lVar3);
    if ((psVar24[0x21a] != psVar24[lStack_48 + 0x21b]) &&
       (1 < *(uint *)(psVar24 + lStack_48 * 4 + 0x22c))) {
      psVar24[lStack_48 + 0x218] = (snd_pcm_t)0x1;
    }
    puVar19 = *(undefined8 **)(psVar24 + 0x1f0);
    if (puVar19 == (undefined8 *)0x0) {
      *(undefined8 *)(__s + -8) = 0x18a802;
      puVar19 = (undefined8 *)operator_new(0x50);
      *(undefined1 *)(puVar19 + 9) = 0;
      *puVar19 = 0;
      puVar19[1] = 0;
      *(undefined4 *)((long)puVar19 + 0xf) = 0;
      *(undefined8 *)(__s + -8) = 0x18a824;
      iVar9 = pthread_cond_init((pthread_cond_t *)(puVar19 + 3),(pthread_condattr_t *)0x0);
      if (iVar9 == 0) {
        *(undefined8 **)(psVar24 + 0x1f0) = puVar19;
        *puVar19 = 0;
        puVar19[1] = 0;
        goto LAB_0018a4c3;
      }
      name.field_2._8_8_ = puVar19;
      *(undefined8 *)(__s + -8) = 0x18a843;
      std::__cxx11::string::operator=
                ((string *)(psVar24 + 0x180),
                 "RtApiAlsa::probeDeviceOpen: error initializing pthread condition variable.");
    }
    else {
LAB_0018a4c3:
      lVar14 = lStack_48;
      puVar19[lStack_48] = local_40;
      local_40 = 0;
      iVar9 = *(int *)(psVar24 + lStack_48 * 4 + 0x22c);
      uVar12 = *bufferSize;
      RVar4 = *(RtAudioFormat *)(psVar24 + 600);
      name.field_2._8_8_ = puVar19;
      *(undefined8 *)(__s + -8) = 0x18a4f8;
      uVar13 = RtApi::formatBytes((RtApi *)psVar24,RVar4);
      *(undefined8 *)(__s + -8) = 0x18a50c;
      pvVar18 = calloc((ulong)(uVar12 * iVar9 * uVar13),1);
      psVar24 = phandle;
      *(void **)(phandle + lVar14 * 8 + 0x200) = pvVar18;
      if (pvVar18 != (void *)0x0) {
        if (phandle[lVar14 + 0x218] == (snd_pcm_t)0x1) {
          iVar9 = *(int *)(phandle + lVar14 * 4 + 0x234);
          RVar4 = *(RtAudioFormat *)(phandle + lVar14 * 8 + 0x260);
          *(undefined8 *)(__s + -8) = 0x18a545;
          uVar12 = RtApi::formatBytes((RtApi *)psVar24,RVar4);
          psVar24 = phandle;
          pvVar18 = *(void **)(phandle + 0x210);
          if (pvVar18 != (void *)0x0 && (mode == INPUT && *(int *)(phandle + 0x1f8) == 0)) {
            iVar10 = *(int *)(phandle + 0x234);
            RVar4 = *(RtAudioFormat *)(phandle + 0x260);
            *(undefined8 *)(__s + -8) = 0x18a585;
            uVar13 = RtApi::formatBytes((RtApi *)psVar24,RVar4);
            lVar14 = lStack_48;
            if (uVar12 * iVar9 <= uVar13 * iVar10) goto LAB_0018a5d6;
            pvVar18 = *(void **)(phandle + 0x210);
          }
          uVar13 = *bufferSize;
          if (pvVar18 != (void *)0x0) {
            *(undefined8 *)(__s + -8) = 0x18a5b1;
            free(pvVar18);
          }
          *(undefined8 *)(__s + -8) = 0x18a5be;
          pvVar18 = calloc((ulong)uVar13 * (ulong)(uVar12 * iVar9),1);
          *(void **)(phandle + 0x210) = pvVar18;
          lVar14 = lStack_48;
          if (pvVar18 == (void *)0x0) {
            psVar23 = (string *)(phandle + 0x180);
            *(undefined8 *)(__s + -8) = 0x18a8e1;
            std::__cxx11::string::operator=
                      (psVar23,"RtApiAlsa::probeDeviceOpen: error allocating device buffer memory.")
            ;
            goto LAB_0018a9cd;
          }
        }
LAB_0018a5d6:
        psVar24 = phandle;
        iVar9 = dir;
        *(uint *)(phandle + 0x220) = local_c0;
        *(uint *)(phandle + 0x228) = local_4c;
        *(uint *)(phandle + lVar14 * 4 + 0x1e8) = deviceId;
        *(undefined4 *)(phandle + 0x1fc) = 0;
        if (phandle[lVar14 + 0x218] == (snd_pcm_t)0x1) {
          *(undefined8 *)(__s + -8) = 0x18a61a;
          RtApi::setConvertInfo((RtApi *)psVar24,mode,iVar9);
        }
        psVar24 = phandle;
        if ((mode == INPUT) && (*(int *)(phandle + 0x1f8) == 0)) {
          *(undefined4 *)(phandle + 0x1f8) = 2;
          *(undefined1 *)(name.field_2._8_8_ + 0x10) = 0;
          uVar2 = *(undefined8 *)name.field_2._8_8_;
          uVar5 = *(undefined8 *)(name.field_2._8_8_ + 8);
          *(undefined8 *)(__s + -8) = 0x18a655;
          iVar9 = snd_pcm_link(uVar2,uVar5);
          if (iVar9 != 0) {
            psVar23 = (string *)(phandle + 0x180);
            *(undefined8 *)(__s + -8) = 0x18a674;
            std::__cxx11::string::operator=
                      (psVar23,
                       "RtApiAlsa::probeDeviceOpen: unable to synchronize input and output devices."
                      );
            psVar24 = phandle;
            bVar22 = true;
            *(undefined8 *)(__s + -8) = 0x18a685;
            RtApi::error((RtApi *)psVar24,RTAUDIO_WARNING);
            goto LAB_0018a740;
          }
          *(undefined1 *)(name.field_2._8_8_ + 0x10) = 1;
        }
        else {
          *(StreamMode *)(phandle + 0x1f8) = mode;
          __arg = phandle + 0x298;
          *(snd_pcm_t **)(phandle + 0x298) = phandle;
          *(undefined8 *)(__s + -8) = 0x18a884;
          pthread_attr_init((pthread_attr_t *)&sampleRate_local);
          *(undefined8 *)(__s + -8) = 0x18a88e;
          pthread_attr_setdetachstate((pthread_attr_t *)&sampleRate_local,0);
          if ((options == (StreamOptions *)0x0) || ((options->flags & 8) == 0)) {
            *(undefined8 *)(__s + -8) = 0x18a8aa;
            pthread_attr_setschedpolicy((pthread_attr_t *)&sampleRate_local,0);
          }
          else {
            psVar24[0x2c1] = (snd_pcm_t)0x1;
            iVar9 = options->priority;
            *(undefined8 *)(__s + -8) = 0x18a8fc;
            iVar10 = sched_get_priority_min(2);
            *(undefined8 *)(__s + -8) = 0x18a908;
            local_dc.__sched_priority = sched_get_priority_max(2);
            if (iVar9 < local_dc.__sched_priority) {
              local_dc.__sched_priority = iVar9;
            }
            if (iVar9 < iVar10) {
              local_dc.__sched_priority = iVar10;
            }
            *(undefined8 *)(__s + -8) = 0x18a932;
            pthread_attr_setschedpolicy((pthread_attr_t *)&sampleRate_local,2);
            *(undefined8 *)(__s + -8) = 0x18a93c;
            pthread_attr_setscope((pthread_attr_t *)&sampleRate_local,0);
            *(undefined8 *)(__s + -8) = 0x18a949;
            pthread_attr_setinheritsched((pthread_attr_t *)&sampleRate_local,1);
            *(undefined8 *)(__s + -8) = 0x18a954;
            pthread_attr_setschedparam((pthread_attr_t *)&sampleRate_local,&local_dc);
          }
          psVar24[0x2c0] = (snd_pcm_t)0x1;
          *(undefined8 *)(__s + -8) = 0x18a97f;
          iVar9 = pthread_create((pthread_t *)(psVar24 + 0x2a0),(pthread_attr_t *)&sampleRate_local,
                                 alsaCallbackHandler,__arg);
          *(undefined8 *)(__s + -8) = 0x18a98a;
          pthread_attr_destroy((pthread_attr_t *)&sampleRate_local);
          if (iVar9 != 0) {
            *(undefined8 *)(__s + -8) = 0x18a9a7;
            iVar9 = pthread_create((pthread_t *)(psVar24 + 0x2a0),(pthread_attr_t *)0x0,
                                   alsaCallbackHandler,__arg);
            if (iVar9 != 0) {
              phandle[0x2c0] = (snd_pcm_t)0x0;
              psVar23 = (string *)(phandle + 0x180);
              *(undefined8 *)(__s + -8) = 0x18a9cd;
              std::__cxx11::string::operator=(psVar23,"RtApiAlsa::error creating callback thread!");
              goto LAB_0018a9cd;
            }
          }
        }
        bVar22 = true;
        goto LAB_0018a740;
      }
      psVar23 = (string *)(phandle + 0x180);
      *(undefined8 *)(__s + -8) = 0x18a85b;
      std::__cxx11::string::operator=
                (psVar23,"RtApiAlsa::probeDeviceOpen: error allocating user buffer memory.");
    }
LAB_0018a9cd:
    uVar2 = name.field_2._8_8_;
    __cond = (pthread_cond_t *)(name.field_2._8_8_ + 0x18);
    *(undefined8 *)(__s + -8) = 0x18a9da;
    pthread_cond_destroy(__cond);
    if (*(long *)uVar2 != 0) {
      *(undefined8 *)(__s + -8) = 0x18a9e7;
      snd_pcm_close();
    }
    if (*(long *)(name.field_2._8_8_ + 8) != 0) {
      *(undefined8 *)(__s + -8) = 0x18a9f9;
      snd_pcm_close();
    }
    uVar2 = name.field_2._8_8_;
    *(undefined8 *)(__s + -8) = 0x18aa02;
    operator_delete((void *)uVar2);
    *(undefined8 *)(phandle + 0x1f0) = 0;
    if (local_40 != 0) {
      *(undefined8 *)(__s + -8) = 0x18aa1f;
      snd_pcm_close();
    }
    psVar24 = phandle;
    lVar14 = 0;
    bVar22 = true;
    do {
      bVar20 = bVar22;
      pvVar18 = *(void **)(psVar24 + lVar14 * 8 + 0x200);
      if (pvVar18 != (void *)0x0) {
        *(undefined8 *)(__s + -8) = 0x18aa3a;
        free(pvVar18);
        *(undefined8 *)(psVar24 + lVar14 * 8 + 0x200) = 0;
      }
      lVar14 = 1;
      bVar22 = false;
    } while (bVar20);
    pvVar18 = *(void **)(psVar24 + 0x210);
    if (pvVar18 != (void *)0x0) {
      *(undefined8 *)(__s + -8) = 0x18aa67;
      free(pvVar18);
      *(undefined8 *)(psVar24 + 0x210) = 0;
    }
    *(undefined4 *)(psVar24 + 0x1fc) = 0xffffffce;
  }
  bVar22 = false;
LAB_0018a740:
  psVar6 = psStack_78;
  if (psStack_78 != &name._M_string_length) {
    *(undefined8 *)(__s + -8) = 0x18a752;
    operator_delete(psVar6);
  }
  return bVar22;
}

Assistant:

bool RtApiAlsa :: probeDeviceOpen( unsigned int deviceId, StreamMode mode, unsigned int channels,
                                   unsigned int firstChannel, unsigned int sampleRate,
                                   RtAudioFormat format, unsigned int *bufferSize,
                                   RtAudio::StreamOptions *options )

{
#if defined(__RTAUDIO_DEBUG__)
  struct SndOutputTdealloc {
    SndOutputTdealloc() : _out(NULL) { snd_output_stdio_attach(&_out, stderr, 0); }
    ~SndOutputTdealloc() { snd_output_close(_out); }
    operator snd_output_t*() { return _out; }
    snd_output_t *_out;
  } out;
#endif

  std::string name;
  for ( auto& id : deviceIdPairs_) {
    if ( id.second == deviceId ) {
      name = id.first;
      break;
    }
  }

  snd_pcm_stream_t stream;
  if ( mode == OUTPUT )
    stream = SND_PCM_STREAM_PLAYBACK;
  else
    stream = SND_PCM_STREAM_CAPTURE;

  snd_pcm_t *phandle;
  int openMode = SND_PCM_ASYNC;
  int result = snd_pcm_open( &phandle, name.c_str(), stream, openMode );
  if ( result < 0 ) {
    if ( mode == OUTPUT )
      errorStream_ << "RtApiAlsa::probeDeviceOpen: pcm device (" << name << ") won't open for output.";
    else
      errorStream_ << "RtApiAlsa::probeDeviceOpen: pcm device (" << name << ") won't open for input.";
    errorText_ = errorStream_.str();
    return FAILURE;
  }

  // Fill the parameter structure.
  snd_pcm_hw_params_t *hw_params;
  snd_pcm_hw_params_alloca( &hw_params );
  result = snd_pcm_hw_params_any( phandle, hw_params );
  if ( result < 0 ) {
    snd_pcm_close( phandle );
    errorStream_ << "RtApiAlsa::probeDeviceOpen: error getting pcm device (" << name << ") parameters, " << snd_strerror( result ) << ".";
    errorText_ = errorStream_.str();
    return FAILURE;
  }

#if defined(__RTAUDIO_DEBUG__)
  fprintf( stderr, "\nRtApiAlsa: dump hardware params just after device open:\n\n" );
  snd_pcm_hw_params_dump( hw_params, out );
#endif

  // Set access ... check user preference.
  if ( options && options->flags & RTAUDIO_NONINTERLEAVED ) {
    stream_.userInterleaved = false;
    result = snd_pcm_hw_params_set_access( phandle, hw_params, SND_PCM_ACCESS_RW_NONINTERLEAVED );
    if ( result < 0 ) {
      result = snd_pcm_hw_params_set_access( phandle, hw_params, SND_PCM_ACCESS_RW_INTERLEAVED );
      stream_.deviceInterleaved[mode] =  true;
    }
    else
      stream_.deviceInterleaved[mode] = false;
  }
  else {
    stream_.userInterleaved = true;
    result = snd_pcm_hw_params_set_access( phandle, hw_params, SND_PCM_ACCESS_RW_INTERLEAVED );
    if ( result < 0 ) {
      result = snd_pcm_hw_params_set_access( phandle, hw_params, SND_PCM_ACCESS_RW_NONINTERLEAVED );
      stream_.deviceInterleaved[mode] =  false;
    }
    else
      stream_.deviceInterleaved[mode] =  true;
  }

  if ( result < 0 ) {
    snd_pcm_close( phandle );
    errorStream_ << "RtApiAlsa::probeDeviceOpen: error setting pcm device (" << name << ") access, " << snd_strerror( result ) << ".";
    errorText_ = errorStream_.str();
    return FAILURE;
  }

  // Determine how to set the device format.
  stream_.userFormat = format;
  snd_pcm_format_t deviceFormat = SND_PCM_FORMAT_UNKNOWN;

  if ( format == RTAUDIO_SINT8 )
    deviceFormat = SND_PCM_FORMAT_S8;
  else if ( format == RTAUDIO_SINT16 )
    deviceFormat = SND_PCM_FORMAT_S16;
  else if ( format == RTAUDIO_SINT24 )
    deviceFormat = SND_PCM_FORMAT_S24;
  else if ( format == RTAUDIO_SINT32 )
    deviceFormat = SND_PCM_FORMAT_S32;
  else if ( format == RTAUDIO_FLOAT32 )
    deviceFormat = SND_PCM_FORMAT_FLOAT;
  else if ( format == RTAUDIO_FLOAT64 )
    deviceFormat = SND_PCM_FORMAT_FLOAT64;

  if ( snd_pcm_hw_params_test_format(phandle, hw_params, deviceFormat) == 0) {
    stream_.deviceFormat[mode] = format;
    goto setFormat;
  }

  // The user requested format is not natively supported by the device.
  deviceFormat = SND_PCM_FORMAT_FLOAT64;
  if ( snd_pcm_hw_params_test_format( phandle, hw_params, deviceFormat ) == 0 ) {
    stream_.deviceFormat[mode] = RTAUDIO_FLOAT64;
    goto setFormat;
  }

  deviceFormat = SND_PCM_FORMAT_FLOAT;
  if ( snd_pcm_hw_params_test_format(phandle, hw_params, deviceFormat ) == 0 ) {
    stream_.deviceFormat[mode] = RTAUDIO_FLOAT32;
    goto setFormat;
  }

  deviceFormat = SND_PCM_FORMAT_S32;
  if ( snd_pcm_hw_params_test_format(phandle, hw_params, deviceFormat ) == 0 ) {
    stream_.deviceFormat[mode] = RTAUDIO_SINT32;
    goto setFormat;
  }

  deviceFormat = SND_PCM_FORMAT_S24;
  if ( snd_pcm_hw_params_test_format(phandle, hw_params, deviceFormat ) == 0 ) {
    stream_.deviceFormat[mode] = RTAUDIO_SINT24;
    goto setFormat;
  }

  deviceFormat = SND_PCM_FORMAT_S16;
  if ( snd_pcm_hw_params_test_format(phandle, hw_params, deviceFormat ) == 0 ) {
    stream_.deviceFormat[mode] = RTAUDIO_SINT16;
    goto setFormat;
  }

  deviceFormat = SND_PCM_FORMAT_S8;
  if ( snd_pcm_hw_params_test_format(phandle, hw_params, deviceFormat ) == 0 ) {
    stream_.deviceFormat[mode] = RTAUDIO_SINT8;
    goto setFormat;
  }

  // If we get here, no supported format was found.
  snd_pcm_close( phandle );
  errorStream_ << "RtApiAlsa::probeDeviceOpen: pcm device (" << name << ") data format not supported by RtAudio.";
  errorText_ = errorStream_.str();
  return FAILURE;

 setFormat:
  result = snd_pcm_hw_params_set_format( phandle, hw_params, deviceFormat );
  if ( result < 0 ) {
    snd_pcm_close( phandle );
    errorStream_ << "RtApiAlsa::probeDeviceOpen: error setting pcm device (" << name << ") data format, " << snd_strerror( result ) << ".";
    errorText_ = errorStream_.str();
    return FAILURE;
  }

  // Determine whether byte-swaping is necessary.
  stream_.doByteSwap[mode] = false;
  if ( deviceFormat != SND_PCM_FORMAT_S8 ) {
    result = snd_pcm_format_cpu_endian( deviceFormat );
    if ( result == 0 )
      stream_.doByteSwap[mode] = true;
    else if (result < 0) {
      snd_pcm_close( phandle );
      errorStream_ << "RtApiAlsa::probeDeviceOpen: error getting pcm device (" << name << ") endian-ness, " << snd_strerror( result ) << ".";
      errorText_ = errorStream_.str();
      return FAILURE;
    }
  }

  // Set the sample rate.
  result = snd_pcm_hw_params_set_rate_near( phandle, hw_params, (unsigned int*) &sampleRate, 0 );
  if ( result < 0 ) {
    snd_pcm_close( phandle );
    errorStream_ << "RtApiAlsa::probeDeviceOpen: error setting sample rate on device (" << name << "), " << snd_strerror( result ) << ".";
    errorText_ = errorStream_.str();
    return FAILURE;
  }

  // Determine the number of channels for this device.  We support a possible
  // minimum device channel number > than the value requested by the user.
  stream_.nUserChannels[mode] = channels;
  unsigned int value;
  result = snd_pcm_hw_params_get_channels_max( hw_params, &value );
  unsigned int deviceChannels = value;
  if ( result < 0 || deviceChannels < channels + firstChannel ) {
    snd_pcm_close( phandle );
    errorStream_ << "RtApiAlsa::probeDeviceOpen: requested channel parameters not supported by device (" << name << "), " << snd_strerror( result ) << ".";
    errorText_ = errorStream_.str();
    return FAILURE;
  }

  result = snd_pcm_hw_params_get_channels_min( hw_params, &value );
  if ( result < 0 ) {
    snd_pcm_close( phandle );
    errorStream_ << "RtApiAlsa::probeDeviceOpen: error getting minimum channels for device (" << name << "), " << snd_strerror( result ) << ".";
    errorText_ = errorStream_.str();
    return FAILURE;
  }
  deviceChannels = value;
  if ( deviceChannels < channels + firstChannel ) deviceChannels = channels + firstChannel;
  stream_.nDeviceChannels[mode] = deviceChannels;

  // Set the device channels.
  result = snd_pcm_hw_params_set_channels( phandle, hw_params, deviceChannels );
  if ( result < 0 ) {
    snd_pcm_close( phandle );
    errorStream_ << "RtApiAlsa::probeDeviceOpen: error setting channels for device (" << name << "), " << snd_strerror( result ) << ".";
    errorText_ = errorStream_.str();
    return FAILURE;
  }

  // Set the buffer (or period) size.
  int dir = 0;
  snd_pcm_uframes_t periodSize = *bufferSize;
  result = snd_pcm_hw_params_set_period_size_near( phandle, hw_params, &periodSize, &dir );
  if ( result < 0 ) {
    snd_pcm_close( phandle );
    errorStream_ << "RtApiAlsa::probeDeviceOpen: error setting period size for device (" << name << "), " << snd_strerror( result ) << ".";
    errorText_ = errorStream_.str();
    return FAILURE;
  }
  *bufferSize = periodSize;

  // Set the buffer number, which in ALSA is referred to as the "period".
  unsigned int periods = 0;
  if ( options && options->flags & RTAUDIO_MINIMIZE_LATENCY ) periods = 2;
  if ( options && options->numberOfBuffers > 0 ) periods = options->numberOfBuffers;
  if ( periods < 2 ) periods = 4; // a fairly safe default value
  result = snd_pcm_hw_params_set_periods_near( phandle, hw_params, &periods, &dir );
  if ( result < 0 ) {
    snd_pcm_close( phandle );
    errorStream_ << "RtApiAlsa::probeDeviceOpen: error setting periods for device (" << name << "), " << snd_strerror( result ) << ".";
    errorText_ = errorStream_.str();
    return FAILURE;
  }

  // If attempting to setup a duplex stream, the bufferSize parameter
  // MUST be the same in both directions!
  if ( stream_.mode == OUTPUT && mode == INPUT && *bufferSize != stream_.bufferSize ) {
    snd_pcm_close( phandle );
    errorStream_ << "RtApiAlsa::probeDeviceOpen: system error setting buffer size for duplex stream on device (" << name << ").";
    errorText_ = errorStream_.str();
    return FAILURE;
  }

  stream_.bufferSize = *bufferSize;

  // Install the hardware configuration
  result = snd_pcm_hw_params( phandle, hw_params );
  if ( result < 0 ) {
    snd_pcm_close( phandle );
    errorStream_ << "RtApiAlsa::probeDeviceOpen: error installing hardware configuration on device (" << name << "), " << snd_strerror( result ) << ".";
    errorText_ = errorStream_.str();
    return FAILURE;
  }

#if defined(__RTAUDIO_DEBUG__)
  fprintf(stderr, "\nRtApiAlsa: dump hardware params after installation:\n\n");
  snd_pcm_hw_params_dump( hw_params, out );
#endif

  // Set the software configuration to fill buffers with zeros and prevent device stopping on xruns.
  snd_pcm_sw_params_t *sw_params = NULL;
  snd_pcm_sw_params_alloca( &sw_params );
  snd_pcm_sw_params_current( phandle, sw_params );
  snd_pcm_sw_params_set_start_threshold( phandle, sw_params, *bufferSize );
  snd_pcm_sw_params_set_stop_threshold( phandle, sw_params, ULONG_MAX );
  snd_pcm_sw_params_set_silence_threshold( phandle, sw_params, 0 );

  // The following two settings were suggested by Theo Veenker
  //snd_pcm_sw_params_set_avail_min( phandle, sw_params, *bufferSize );
  //snd_pcm_sw_params_set_xfer_align( phandle, sw_params, 1 );

  // here are two options for a fix
  //snd_pcm_sw_params_set_silence_size( phandle, sw_params, ULONG_MAX );
  snd_pcm_uframes_t val;
  snd_pcm_sw_params_get_boundary( sw_params, &val );
  snd_pcm_sw_params_set_silence_size( phandle, sw_params, val );

  result = snd_pcm_sw_params( phandle, sw_params );
  if ( result < 0 ) {
    snd_pcm_close( phandle );
    errorStream_ << "RtApiAlsa::probeDeviceOpen: error installing software configuration on device (" << name << "), " << snd_strerror( result ) << ".";
    errorText_ = errorStream_.str();
    return FAILURE;
  }

#if defined(__RTAUDIO_DEBUG__)
  fprintf(stderr, "\nRtApiAlsa: dump software params after installation:\n\n");
  snd_pcm_sw_params_dump( sw_params, out );
#endif

  // Set flags for buffer conversion
  stream_.doConvertBuffer[mode] = false;
  if ( stream_.userFormat != stream_.deviceFormat[mode] )
    stream_.doConvertBuffer[mode] = true;
  if ( stream_.nUserChannels[mode] < stream_.nDeviceChannels[mode] )
    stream_.doConvertBuffer[mode] = true;
  if ( stream_.userInterleaved != stream_.deviceInterleaved[mode] &&
       stream_.nUserChannels[mode] > 1 )
    stream_.doConvertBuffer[mode] = true;

  // Allocate the ApiHandle if necessary and then save.
  AlsaHandle *apiInfo = 0;
  if ( stream_.apiHandle == 0 ) {
    try {
      apiInfo = (AlsaHandle *) new AlsaHandle;
    }
    catch ( std::bad_alloc& ) {
      errorText_ = "RtApiAlsa::probeDeviceOpen: error allocating AlsaHandle memory.";
      goto error;
    }

    if ( pthread_cond_init( &apiInfo->runnable_cv, NULL ) ) {
      errorText_ = "RtApiAlsa::probeDeviceOpen: error initializing pthread condition variable.";
      goto error;
    }

    stream_.apiHandle = (void *) apiInfo;
    apiInfo->handles[0] = 0;
    apiInfo->handles[1] = 0;
  }
  else {
    apiInfo = (AlsaHandle *) stream_.apiHandle;
  }
  apiInfo->handles[mode] = phandle;
  phandle = 0;

  // Allocate necessary internal buffers.
  unsigned long bufferBytes;
  bufferBytes = stream_.nUserChannels[mode] * *bufferSize * formatBytes( stream_.userFormat );
  stream_.userBuffer[mode] = (char *) calloc( bufferBytes, 1 );
  if ( stream_.userBuffer[mode] == NULL ) {
    errorText_ = "RtApiAlsa::probeDeviceOpen: error allocating user buffer memory.";
    goto error;
  }

  if ( stream_.doConvertBuffer[mode] ) {

    bool makeBuffer = true;
    bufferBytes = stream_.nDeviceChannels[mode] * formatBytes( stream_.deviceFormat[mode] );
    if ( mode == INPUT ) {
      if ( stream_.mode == OUTPUT && stream_.deviceBuffer ) {
        unsigned long bytesOut = stream_.nDeviceChannels[0] * formatBytes( stream_.deviceFormat[0] );
        if ( bufferBytes <= bytesOut ) makeBuffer = false;
      }
    }

    if ( makeBuffer ) {
      bufferBytes *= *bufferSize;
      if ( stream_.deviceBuffer ) free( stream_.deviceBuffer );
      stream_.deviceBuffer = (char *) calloc( bufferBytes, 1 );
      if ( stream_.deviceBuffer == NULL ) {
        errorText_ = "RtApiAlsa::probeDeviceOpen: error allocating device buffer memory.";
        goto error;
      }
    }
  }

  stream_.sampleRate = sampleRate;
  stream_.nBuffers = periods;
  stream_.deviceId[mode] = deviceId;
  stream_.state = STREAM_STOPPED;

  // Setup the buffer conversion information structure.
  if ( stream_.doConvertBuffer[mode] ) setConvertInfo( mode, firstChannel );

  // Setup thread if necessary.
  if ( stream_.mode == OUTPUT && mode == INPUT ) {
    // We had already set up an output stream.
    stream_.mode = DUPLEX;
    // Link the streams if possible.
    apiInfo->synchronized = false;
    if ( snd_pcm_link( apiInfo->handles[0], apiInfo->handles[1] ) == 0 )
      apiInfo->synchronized = true;
    else {
      errorText_ = "RtApiAlsa::probeDeviceOpen: unable to synchronize input and output devices.";
      error( RTAUDIO_WARNING );
    }
  }
  else {
    stream_.mode = mode;

    // Setup callback thread.
    stream_.callbackInfo.object = (void *) this;

    // Set the thread attributes for joinable and realtime scheduling
    // priority (optional).  The higher priority will only take affect
    // if the program is run as root or suid. Note, under Linux
    // processes with CAP_SYS_NICE privilege, a user can change
    // scheduling policy and priority (thus need not be root). See
    // POSIX "capabilities".
    pthread_attr_t attr;
    pthread_attr_init( &attr );
    pthread_attr_setdetachstate( &attr, PTHREAD_CREATE_JOINABLE );
#ifdef SCHED_RR // Undefined with some OSes (e.g. NetBSD 1.6.x with GNU Pthread)
    if ( options && options->flags & RTAUDIO_SCHEDULE_REALTIME ) {
      stream_.callbackInfo.doRealtime = true;
      struct sched_param param;
      int priority = options->priority;
      int min = sched_get_priority_min( SCHED_RR );
      int max = sched_get_priority_max( SCHED_RR );
      if ( priority < min ) priority = min;
      else if ( priority > max ) priority = max;
      param.sched_priority = priority;

      // Set the policy BEFORE the priority. Otherwise it fails.
      pthread_attr_setschedpolicy(&attr, SCHED_RR);
      pthread_attr_setscope (&attr, PTHREAD_SCOPE_SYSTEM);
      // This is definitely required. Otherwise it fails.
      pthread_attr_setinheritsched(&attr, PTHREAD_EXPLICIT_SCHED);
      pthread_attr_setschedparam(&attr, &param);
    }
    else
      pthread_attr_setschedpolicy( &attr, SCHED_OTHER );
#else
    pthread_attr_setschedpolicy( &attr, SCHED_OTHER );
#endif

    stream_.callbackInfo.isRunning = true;
    result = pthread_create( &stream_.callbackInfo.thread, &attr, alsaCallbackHandler, &stream_.callbackInfo );
    pthread_attr_destroy( &attr );
    if ( result ) {
      // Failed. Try instead with default attributes.
      result = pthread_create( &stream_.callbackInfo.thread, NULL, alsaCallbackHandler, &stream_.callbackInfo );
      if ( result ) {
        stream_.callbackInfo.isRunning = false;
        errorText_ = "RtApiAlsa::error creating callback thread!";
        goto error;
      }
    }
  }

  return SUCCESS;

 error:
  if ( apiInfo ) {
    pthread_cond_destroy( &apiInfo->runnable_cv );
    if ( apiInfo->handles[0] ) snd_pcm_close( apiInfo->handles[0] );
    if ( apiInfo->handles[1] ) snd_pcm_close( apiInfo->handles[1] );
    delete apiInfo;
    stream_.apiHandle = 0;
  }

  if ( phandle) snd_pcm_close( phandle );

  for ( int i=0; i<2; i++ ) {
    if ( stream_.userBuffer[i] ) {
      free( stream_.userBuffer[i] );
      stream_.userBuffer[i] = 0;
    }
  }

  if ( stream_.deviceBuffer ) {
    free( stream_.deviceBuffer );
    stream_.deviceBuffer = 0;
  }

  stream_.state = STREAM_CLOSED;
  return FAILURE;
}